

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

JavascriptPromiseCapability *
TTD::NSSnapValues::InflatePromiseCapabilityInfo
          (SnapPromiseCapabilityInfo *capabilityInfo,ScriptContext *ctx,InflateMap *inflator)

{
  bool bVar1;
  Var promise;
  Var resolve;
  Var reject;
  JavascriptPromiseCapability *pJVar2;
  
  bVar1 = InflateMap::IsPromiseInfoDefined<Js::JavascriptPromiseCapability>
                    (inflator,capabilityInfo->CapabilityId);
  if (!bVar1) {
    promise = InflateMap::InflateTTDVar(inflator,capabilityInfo->PromiseVar);
    resolve = InflateMap::InflateTTDVar(inflator,capabilityInfo->ResolveVar);
    reject = InflateMap::InflateTTDVar(inflator,capabilityInfo->RejectVar);
    pJVar2 = Js::JavascriptLibrary::CreatePromiseCapability_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,promise,resolve,reject);
    InflateMap::AddInflatedPromiseInfo<Js::JavascriptPromiseCapability>
              (inflator,capabilityInfo->CapabilityId,pJVar2);
  }
  pJVar2 = InflateMap::LookupInflatedPromiseInfo<Js::JavascriptPromiseCapability>
                     (inflator,capabilityInfo->CapabilityId);
  return pJVar2;
}

Assistant:

Js::JavascriptPromiseCapability* InflatePromiseCapabilityInfo(const SnapPromiseCapabilityInfo* capabilityInfo, Js::ScriptContext* ctx, InflateMap* inflator)
        {
            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId))
            {
                Js::Var promise = inflator->InflateTTDVar(capabilityInfo->PromiseVar);
                Js::Var resolve = inflator->InflateTTDVar(capabilityInfo->ResolveVar);
                Js::Var reject = inflator->InflateTTDVar(capabilityInfo->RejectVar);

                Js::JavascriptPromiseCapability* res = ctx->GetLibrary()->CreatePromiseCapability_TTD(promise, resolve, reject);
                inflator->AddInflatedPromiseInfo<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId, res);
            }

            return inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId);
        }